

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::
     LogFatal<char_const(&)[16],char_const(&)[14],char_const(&)[16],pbrt::Point2<int>&,char_const(&)[14],pbrt::Point2<int>&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [16],char (*args_1) [14],
               char (*args_2) [16],Point2<int> *args_3,char (*args_4) [14],Point2<int> *args_5)

{
  char (*in_RCX) [14];
  undefined4 in_EDX;
  char *in_stack_00000028;
  int in_stack_00000034;
  string s;
  Point2<int> *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [16];
  char (*in_stack_ffffffffffffffb8) [14];
  char (*in_stack_ffffffffffffffc0) [16];
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  StringPrintf<char_const(&)[16],char_const(&)[14],char_const(&)[16],pbrt::Point2<int>&,char_const(&)[14],pbrt::Point2<int>&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX,
             (Point2<int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::c_str();
  LogFatal(s._M_string_length._4_4_,(char *)s._0_8_,in_stack_00000034,in_stack_00000028);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&...args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}